

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O2

void __thiscall QtMWidgets::DateTimePicker::mousePressEvent(DateTimePicker *this,QMouseEvent *event)

{
  int iVar1;
  DateTimePickerPrivate *this_00;
  QPoint QVar2;
  QPointF local_20;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    ((this->d).d)->scrolling = false;
    QVar2 = QMouseEvent::pos(event);
    ((this->d).d)->mousePos = QVar2;
    this_00 = (this->d).d;
    this_00->leftMouseButtonPressed = true;
    QVar2 = QMouseEvent::pos(event);
    local_20.xp = (qreal)QVar2.xp;
    local_20.yp = (qreal)QVar2.yp;
    DateTimePickerPrivate::findMovableSection(this_00,&local_20);
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
DateTimePicker::mousePressEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->scrolling = false;
		d->mousePos = event->pos();
		d->leftMouseButtonPressed = true;
		d->findMovableSection( event->pos() );

		event->accept();
	}
	else
		event->ignore();
}